

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O1

PIPELINE_RESOURCE_FLAGS __thiscall
Diligent::PipelineStateGLImpl::GetSamplerResourceFlag
          (PipelineStateGLImpl *this,TShaderStages *Stages,bool SilenceWarning)

{
  pointer ppSVar1;
  PIPELINE_RESOURCE_FLAGS PVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  char (*in_RCX) [16];
  ShaderGLImpl **Stage;
  pointer ppSVar6;
  char (*in_R8) [205];
  PIPELINE_RESOURCE_FLAGS PVar7;
  string msg;
  string local_40;
  
  if ((Stages->
      super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (Stages->
      super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[16]>
              (&local_40,(Diligent *)"Debug expression failed:\n",(char (*) [26])"!Stages.empty()",
               in_RCX);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"GetSamplerResourceFlag",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x45);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  ppSVar6 = (Stages->
            super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (Stages->
            super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  PVar7 = ~PIPELINE_RESOURCE_FLAG_NONE;
  if (ppSVar6 == ppSVar1) {
    bVar5 = true;
  }
  else {
    bVar3 = 0;
    do {
      PVar2 = (*(int *)&((*ppSVar6)->super_ShaderBase<Diligent::EngineGLImplTraits>).field_0x6c != 1
              ) * '\x02';
      bVar4 = 1;
      if (PVar7 == PVar2) {
        bVar4 = bVar3;
      }
      if (PVar7 != ~PIPELINE_RESOURCE_FLAG_NONE) {
        PVar2 = PVar7;
        bVar3 = bVar4;
      }
      PVar7 = PVar2;
      ppSVar6 = ppSVar6 + 1;
    } while (ppSVar6 != ppSVar1);
    bVar5 = (bool)(bVar3 ^ 1);
  }
  if (!bVar5 && !SilenceWarning) {
    FormatString<char[17],char_const*,char[205]>
              (&local_40,(Diligent *)"Pipeline state \'",
               (char (*) [17])
               &(this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)
                        "\' uses shaders compiled from different source languages. When separable programs are not available, this may result in incorrect pipeline resource flags (NONE vs COMBINED_SAMPLER) determined for textures."
               ,in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,local_40._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return PVar7;
}

Assistant:

PIPELINE_RESOURCE_FLAGS PipelineStateGLImpl::GetSamplerResourceFlag(const TShaderStages& Stages, bool SilenceWarning) const
{
    VERIFY_EXPR(!Stages.empty());

    constexpr auto UndefinedFlag = static_cast<PIPELINE_RESOURCE_FLAGS>(0xFF);

    auto SamplerResourceFlag = UndefinedFlag;
    bool ConflictsFound      = false;
    for (auto& Stage : Stages)
    {
        auto Lang = Stage->GetSourceLanguage();
        auto Flag = Lang == SHADER_SOURCE_LANGUAGE_HLSL ?
            PIPELINE_RESOURCE_FLAG_NONE :
            PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER;

        if (SamplerResourceFlag == UndefinedFlag)
            SamplerResourceFlag = Flag;
        else if (SamplerResourceFlag != Flag)
            ConflictsFound = true;
    }

    if (ConflictsFound && !SilenceWarning)
    {
        LOG_WARNING_MESSAGE("Pipeline state '", m_Desc.Name,
                            "' uses shaders compiled from different source languages. When separable programs are not available, this "
                            "may result in incorrect pipeline resource flags (NONE vs COMBINED_SAMPLER) determined for textures.");
    }

    return SamplerResourceFlag;
}